

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O0

void __thiscall
SGParser::Parse<SGParser::Generator::RegExprNFAParseElement>::ResetParse
          (Parse<SGParser::Generator::RegExprNFAParseElement> *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  size_t sVar5;
  const_reference pvVar6;
  unsigned_long *puVar7;
  unsigned_long *local_40;
  unsigned_long *local_18;
  size_t *newValidTokenSet;
  Parse<SGParser::Generator::RegExprNFAParseElement> *this_local;
  
  newValidTokenSet = (size_t *)this;
  if ((this->pParseTable == (ParseTable *)0x0) ||
     (bVar2 = ParseTable::IsValid(this->pParseTable), !bVar2)) {
    local_40 = (unsigned_long *)0x0;
  }
  else {
    sVar5 = ParseTable::GetTerminalCount(this->pParseTable);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = sVar5;
    uVar4 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    local_40 = (unsigned_long *)operator_new__(uVar4);
  }
  local_18 = local_40;
  CleanupParseStack(this,0);
  BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::ResetStream
            (&this->Stream,this->pTokenizer,1);
  this->StackPosition = 0;
  sVar5 = BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::GetTokenIndex
                    (&this->Stream);
  this->PrevTokenIndex = sVar5;
  if (((this->pParseTable == (ParseTable *)0x0) ||
      (this->pTokenizer == (TokenStream<SGParser::Generator::RegExprParseToken> *)0x0)) ||
     (bVar2 = ParseTable::IsValid(this->pParseTable), !bVar2)) {
    this->TopState = 0xffffffff;
    (this->pStack->super_ParseStackElement<SGParser::Generator::RegExprParseToken>).State =
         0xffffffff;
  }
  else {
    uVar3 = ParseTable::GetInitialState(this->pParseTable);
    this->TopState = uVar3;
    (this->pStack->super_ParseStackElement<SGParser::Generator::RegExprParseToken>).State =
         this->TopState;
    if (this->TopState == 0xffffffff) {
      __assert_fail("TopState != InvalidState",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/Parser/./Parser.h"
                    ,0x178,
                    "void SGParser::Parse<SGParser::Generator::RegExprNFAParseElement>::ResetParse()"
                   );
    }
    pvVar6 = std::
             vector<SGParser::ParseTable::StateInfo,_std::allocator<SGParser::ParseTable::StateInfo>_>
             ::operator[](&this->pParseTable->StateInfos,(ulong)this->TopState);
    if (((byte)*pvVar6 & 1) == 0) {
      (this->pStack->super_ParseStackElement<SGParser::Generator::RegExprParseToken>).TerminalMarker
           = 0xffffffffffffffff;
    }
    else {
      sVar5 = BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::GetTokenIndex
                        (&this->Stream);
      (this->pStack->super_ParseStackElement<SGParser::Generator::RegExprParseToken>).TerminalMarker
           = sVar5;
      BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::SetMarker
                (&this->Stream,sVar5);
    }
    puVar7 = std::exchange<unsigned_long*,unsigned_long*&>
                       (&this->pValidTokenStackPositions,&local_18);
    if (puVar7 != (unsigned_long *)0x0) {
      operator_delete__(puVar7);
    }
  }
  this->NextTokenFlag = true;
  return;
}

Assistant:

void Parse<StackElement>::ResetParse() {
    // Token set might have been a different size so it must be reallocated
    // Basic exception safety is provided
    size_t* newValidTokenSet = pParseTable && pParseTable->IsValid()
                                   ? new size_t[pParseTable->GetTerminalCount()]
                                   : nullptr;

    // From this point we can (safely) change the existing data

    // Delete the parse stack
    CleanupParseStack();
    Stream.ResetStream(pTokenizer);

    // Reset the data
    StackPosition  = 0u;
    PrevTokenIndex = Stream.GetTokenIndex();

    // If the parse table and tokenizer are valid then reinitialize the data
    if (pParseTable && pTokenizer && pParseTable->IsValid()) {
        // Set the top and stack state to the initial parse table state
        TopState         = pParseTable->GetInitialState();
        pStack[0u].State = TopState;
        SG_ASSERT(TopState != InvalidState);

        // If the state is recording then initialize the terminal marker
        if (pParseTable->StateInfos[TopState].Record)
            Stream.SetMarker(pStack[0u].TerminalMarker = Stream.GetTokenIndex());
        else
            pStack[0u].TerminalMarker = InvalidIndex;

        delete[] std::exchange(pValidTokenStackPositions, newValidTokenSet);
    }
    // Otherwise, set them to empty
    else {
        TopState         = InvalidState;
        pStack[0u].State = InvalidState;
    }

    NextTokenFlag = true;
}